

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void transaction_in_memory_snapshot_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn1;
  void *thread_ret;
  pthread_t tid;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar2 = fdb_set_log_callback(db,logCallbackFunc,"transaction_in_memory_snapshot_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdf4);
    transaction_in_memory_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdf4,"void transaction_in_memory_snapshot_test()");
  }
  uVar5 = 0;
  do {
    if (uVar5 == 10) {
      fdb_commit(dbfile,'\0');
      fdb_open(&dbfile_txn1,"./mvcc_test1",&fconfig);
      fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
      fdb_begin_transaction(dbfile_txn1,'\x02');
      for (uVar5 = 10; uVar5 != 10000; uVar5 = uVar5 + 1) {
        sprintf(keybuf,"key%d",(ulong)uVar5);
        sprintf(bodybuf,"body%d_txn1",(ulong)uVar5);
        pfVar1 = db_txn1;
        sVar3 = strlen(keybuf);
        sVar4 = strlen(bodybuf);
        fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
      }
      pthread_create(&tid,(pthread_attr_t *)0x0,in_memory_snapshot_thread,db);
      fdb_end_transaction(dbfile_txn1,'\0');
      pthread_join(tid,&thread_ret);
      fdb_close(dbfile);
      fdb_close(dbfile_txn1);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (transaction_in_memory_snapshot_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"transaction and in-memory snapshot interleaving test");
      return;
    }
    sprintf(keybuf,"key%d",(ulong)uVar5);
    sprintf(bodybuf,"body%d",(ulong)uVar5);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
    uVar5 = uVar5 + 1;
  } while (fVar2 == FDB_RESULT_SUCCESS);
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xdfc);
  transaction_in_memory_snapshot_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xdfc,"void transaction_in_memory_snapshot_test()");
}

Assistant:

void transaction_in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1;
    fdb_kvs_handle *db, *db_txn1;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert the first set of key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf,
                            strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin a transaction
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=10;i<10000;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // Create in-memory snapshot thread
    thread_t tid;
    void *thread_ret;
    thread_create(&tid, in_memory_snapshot_thread, (void *)db);

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    thread_join(tid, &thread_ret);

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction and in-memory snapshot interleaving test");
}